

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffcnvthdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
                 int *status)

{
  int iVar1;
  int *in_RDX;
  undefined4 in_ESI;
  fitsfile *in_R9;
  fitsfile *tempfptr;
  int *in_stack_00000068;
  fitsfile *in_stack_00000070;
  fitsfile *in_stack_00000078;
  int *in_stack_000000e0;
  char **in_stack_000000e8;
  int in_stack_000000f4;
  char **in_stack_000000f8;
  int in_stack_00000104;
  fitsfile *in_stack_00000108;
  int *in_stack_00000120;
  int *in_stack_00000868;
  char *in_stack_00000870;
  fitsfile **in_stack_00000878;
  fitsfile *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (0 < tempfptr->HDUposition) {
    return tempfptr->HDUposition;
  }
  iVar1 = fits_is_compressed_image(in_stack_ffffffffffffffb8,(int *)0x1d153e);
  if (iVar1 == 0) {
    ffhdr2str(in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f4,
              in_stack_000000e8,in_stack_000000e0,in_stack_00000120);
  }
  else {
    iVar1 = ffinit(in_stack_00000878,in_stack_00000870,in_stack_00000868);
    if (0 < iVar1) {
      return tempfptr->HDUposition;
    }
    iVar1 = fits_img_decompress_header(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    if (0 < iVar1) {
      ffdelt((fitsfile *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
      return tempfptr->HDUposition;
    }
    ffhdr2str(in_stack_00000108,in_stack_00000104,in_stack_000000f8,in_stack_000000f4,
              in_stack_000000e8,in_stack_000000e0,in_stack_00000120);
    ffclos(in_R9,in_stack_ffffffffffffffc0);
  }
  return tempfptr->HDUposition;
}

Assistant:

int ffcnvthdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  Same as ffhdr2str, except that if the input HDU is a tile compressed image
  (stored in a binary table) then it will first convert that header back
  to that of a normal uncompressed FITS image before concatenating the header
  keyword records.
*/
{
    fitsfile *tempfptr;
    
    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status) )
    {
        /* this is a tile compressed image, so need to make an uncompressed */
	/* copy of the image header in memory before concatenating the keywords */
        if (fits_create_file(&tempfptr, "mem://", status) > 0) {
	    return(*status);
	}

	if (fits_img_decompress_header(fptr, tempfptr, status) > 0) {
	    fits_delete_file(tempfptr, status);
	    return(*status);
	}

	ffhdr2str(tempfptr, exclude_comm, exclist, nexc, header, nkeys, status);
	fits_close_file(tempfptr, status);

    } else {
        ffhdr2str(fptr, exclude_comm, exclist, nexc, header, nkeys, status);
    }

    return(*status);
}